

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_raster.cpp
# Opt level: O0

ClipType __thiscall QRasterPaintEngine::clipType(QRasterPaintEngine *this)

{
  QRasterPaintEnginePrivate *this_00;
  QClipData *pQVar1;
  QClipData *clip;
  QRasterPaintEnginePrivate *d;
  ClipType local_4;
  
  this_00 = d_func((QRasterPaintEngine *)0x5744a7);
  pQVar1 = QRasterPaintEnginePrivate::clip(this_00);
  if ((pQVar1 == (QClipData *)0x0) || (((byte)pQVar1->field_0x48 >> 1 & 1) != 0)) {
    local_4 = RectClip;
  }
  else {
    local_4 = ComplexClip;
  }
  return local_4;
}

Assistant:

QRasterPaintEngine::ClipType QRasterPaintEngine::clipType() const
{
    Q_D(const QRasterPaintEngine);

    const QClipData *clip = d->clip();
    if (!clip || clip->hasRectClip)
        return RectClip;
    else
        return ComplexClip;
}